

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plan_insert.cpp
# Opt level: O3

PhysicalOperator * __thiscall
duckdb::PhysicalPlanGenerator::CreatePlan(PhysicalPlanGenerator *this,LogicalInsert *op)

{
  Catalog *pCVar1;
  int iVar2;
  reference this_00;
  type op_00;
  PhysicalOperator *pPVar3;
  undefined4 extraout_var;
  
  if ((op->super_LogicalOperator).children.
      super_vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (op->super_LogicalOperator).children.
      super_vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pPVar3 = (PhysicalOperator *)0x0;
  }
  else {
    this_00 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
              ::operator[](&(op->super_LogicalOperator).children,0);
    op_00 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
            ::operator*(this_00);
    pPVar3 = CreatePlan(this,op_00);
  }
  LogicalDependencyList::AddDependency(&this->dependencies,(CatalogEntry *)op->table);
  pCVar1 = (op->table->super_StandardEntry).super_InCatalogEntry.catalog;
  iVar2 = (*pCVar1->_vptr_Catalog[0xc])(pCVar1,this->context,this,op,pPVar3);
  return (PhysicalOperator *)CONCAT44(extraout_var,iVar2);
}

Assistant:

PhysicalOperator &PhysicalPlanGenerator::CreatePlan(LogicalInsert &op) {
	optional_ptr<PhysicalOperator> plan;
	if (!op.children.empty()) {
		D_ASSERT(op.children.size() == 1);
		plan = CreatePlan(*op.children[0]);
	}
	dependencies.AddDependency(op.table);
	return op.table.catalog.PlanInsert(context, *this, op, plan);
}